

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MppCluster * __thiscall MppClusterServer::get(MppClusterServer *this,MppClientType client_type)

{
  __pid_t _Var1;
  uint uVar2;
  __pthread_internal_list *p_Var3;
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  MppCluster *p;
  RK_S32 i;
  MppClientType client_type_local;
  MppClusterServer *this_local;
  
  auto_lock.mLock = (Mutex *)0x0;
  if ((int)client_type < 0x1e) {
    Mutex::Autolock::Autolock((Autolock *)local_30,&this->super_Mutex,1);
    auto_lock.mLock = (Mutex *)this->mClusters[client_type];
    if (((MppCluster *)auto_lock.mLock == (MppCluster *)0x0) &&
       (auto_lock.mLock = (Mutex *)mpp_osal_malloc("get",0x80), auto_lock.mLock != (Mutex *)0x0)) {
      for (p._0_4_ = 0; (int)p < 1; p._0_4_ = (int)p + 1) {
        mpp_cluster_queue_init
                  ((ClusterQueue *)((long)auto_lock.mLock + (long)(int)p * 0x48 + 0x20),
                   (MppCluster *)auto_lock.mLock);
      }
      _Var1 = getpid();
      ((auto_lock.mLock)->mMutex).__data.__kind = _Var1;
      *(MppClientType *)((long)&(auto_lock.mLock)->mMutex + 0x14) = client_type;
      snprintf((char *)auto_lock.mLock,0xf,"%d:%d",
               (ulong)(uint)((auto_lock.mLock)->mMutex).__data.__kind,(ulong)client_type);
      *(undefined4 *)((long)&(auto_lock.mLock)->mMutex + 0x18) = 0;
      *(undefined4 *)((long)&(auto_lock.mLock)->mMutex + 0x1c) = 0;
      auto_lock.mLock[3].mMutex.__align = (long)cluster_worker;
      *(RK_U32 *)((long)&auto_lock.mLock[2].mMutex + 0x1c) = mpp_cluster_thd_cnt;
      if ((*(int *)((long)&auto_lock.mLock[2].mMutex + 0x1c) < 1) &&
         (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "p->worker_count > 0","get",0x292), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      p_Var3 = (__pthread_internal_list *)
               mpp_osal_malloc("get",(long)*(int *)((long)&auto_lock.mLock[2].mMutex + 0x1c) * 0x58)
      ;
      auto_lock.mLock[2].mMutex.__data.__list.__next = p_Var3;
      for (p._0_4_ = 0; (int)p < *(int *)((long)&auto_lock.mLock[2].mMutex + 0x1c);
          p._0_4_ = (int)p + 1) {
        cluster_worker_init((ClusterWorker *)
                            ((long)auto_lock.mLock[2].mMutex.__data.__list.__next +
                            (long)(int)p * 0x58),(MppCluster *)auto_lock.mLock);
      }
      this->mClusters[client_type] = (MppCluster *)auto_lock.mLock;
      if ((mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","%s created\n",(char *)0x0,auto_lock.mLock);
      }
    }
    Mutex::Autolock::~Autolock((Autolock *)local_30);
  }
  if (auto_lock.mLock == (Mutex *)0x0) {
    if ((mpp_cluster_debug & 1) != 0) {
      uVar2 = getpid();
      _mpp_log_l(4,"mpp_cluster","%d get cluster %d failed\n",(char *)0x0,(ulong)uVar2,
                 (ulong)client_type);
    }
  }
  else if ((mpp_cluster_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_cluster","%s get\n",(char *)0x0,auto_lock.mLock);
  }
  return (MppCluster *)auto_lock.mLock;
}

Assistant:

MppCluster *MppClusterServer::get(MppClientType client_type)
{
    RK_S32 i;
    MppCluster *p = NULL;

    if (client_type >= VPU_CLIENT_BUTT)
        goto done;

    {
        AutoMutex auto_lock(this);

        p = mClusters[client_type];
        if (p)
            goto done;

        p = mpp_malloc(MppCluster, 1);
        if (p) {
            for (i = 0; i < MAX_PRIORITY; i++)
                mpp_cluster_queue_init(&p->queue[i], p);

            p->pid  = getpid();
            p->client_type = client_type;
            snprintf(p->name, sizeof(p->name) - 1, "%d:%d", p->pid, client_type);
            p->node_id = 0;
            p->worker_id = 0;
            p->worker_func = cluster_worker;
            p->worker_count = mpp_cluster_thd_cnt;

            mpp_assert(p->worker_count > 0);

            p->worker = mpp_malloc(ClusterWorker, p->worker_count);

            for (i = 0; i < p->worker_count; i++)
                cluster_worker_init(&p->worker[i], p);

            mClusters[client_type] = p;
            cluster_dbg_flow("%s created\n", p->name);
        }
    }

done:
    if (p)
        cluster_dbg_flow("%s get\n", p->name);
    else
        cluster_dbg_flow("%d get cluster %d failed\n", getpid(), client_type);

    return p;
}